

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimpleBroadphase.cpp
# Opt level: O2

void __thiscall
btSimpleBroadphase::aabbTest
          (btSimpleBroadphase *this,btVector3 *aabbMin,btVector3 *aabbMax,
          btBroadphaseAabbCallback *callback)

{
  btSimpleBroadphaseProxy *pbVar1;
  bool bVar2;
  int i;
  long lVar3;
  long lVar4;
  
  lVar4 = 0;
  for (lVar3 = 0; lVar3 <= this->m_LastHandleIndex; lVar3 = lVar3 + 1) {
    pbVar1 = this->m_pHandles;
    if (*(long *)((long)(pbVar1->super_btBroadphaseProxy).m_aabbMin.m_floats + lVar4 + -0x1c) != 0)
    {
      bVar2 = TestAabbAgainstAabb2
                        (aabbMin,aabbMax,
                         (btVector3 *)
                         ((long)(pbVar1->super_btBroadphaseProxy).m_aabbMin.m_floats + lVar4),
                         (btVector3 *)
                         ((long)(pbVar1->super_btBroadphaseProxy).m_aabbMax.m_floats + lVar4));
      if (bVar2) {
        (*callback->_vptr_btBroadphaseAabbCallback[2])
                  (callback,(long)(pbVar1->super_btBroadphaseProxy).m_aabbMin.m_floats +
                            lVar4 + -0x1c);
      }
    }
    lVar4 = lVar4 + 0x40;
  }
  return;
}

Assistant:

void	btSimpleBroadphase::aabbTest(const btVector3& aabbMin, const btVector3& aabbMax, btBroadphaseAabbCallback& callback)
{
	for (int i=0; i <= m_LastHandleIndex; i++)
	{
		btSimpleBroadphaseProxy* proxy = &m_pHandles[i];
		if(!proxy->m_clientObject)
		{
			continue;
		}
		if (TestAabbAgainstAabb2(aabbMin,aabbMax,proxy->m_aabbMin,proxy->m_aabbMax))
		{
			callback.process(proxy);
		}
	}
}